

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall chaiscript::parser::ChaiScript_Parser::Lambda(ChaiScript_Parser *this)

{
  bool bVar1;
  eval_error *this_00;
  File_Position *t_where;
  undefined8 uVar2;
  long in_RDI;
  size_type prev_stack_top;
  bool retval;
  ChaiScript_Parser *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe78;
  string *psVar3;
  File_Position *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  eval_error *in_stack_fffffffffffffe90;
  allocator local_131;
  string local_130 [6];
  undefined1 in_stack_fffffffffffffed6;
  char in_stack_fffffffffffffed7;
  ChaiScript_Parser *in_stack_fffffffffffffed8;
  ChaiScript_Parser *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  string local_100 [16];
  undefined8 in_stack_ffffffffffffff10;
  File_Position local_dc;
  undefined1 local_d1 [36];
  undefined1 local_ad;
  File_Position local_ac;
  allocator local_a1;
  string *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  ChaiScript_Parser *in_stack_ffffffffffffff70;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  File_Position local_54 [3];
  allocator local_39;
  string local_38 [32];
  size_type local_18;
  byte local_9;
  
  local_9 = 0;
  local_18 = std::
             vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ::size((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                     *)(in_RDI + 0x70));
  bVar1 = Keyword(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                  (bool)in_stack_fffffffffffffed7);
  if (bVar1) {
    local_9 = 1;
    bVar1 = Char(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,(bool)in_stack_fffffffffffffed6
                );
    if (bVar1) {
      Id_Arg_List((ChaiScript_Parser *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                 );
      bVar1 = Char(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,
                   (bool)in_stack_fffffffffffffed6);
      if (!bVar1) {
        local_55 = 1;
        uVar2 = __cxa_allocate_exception(0x90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_38,"Incomplete anonymous function bind",&local_39);
        File_Position::File_Position(local_54,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffe60);
        exception::eval_error::eval_error
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78);
        local_55 = 0;
        __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"",&local_79);
      build_match<chaiscript::eval::Arg_List_AST_Node>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    bVar1 = Char(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,(bool)in_stack_fffffffffffffed6
                );
    if (!bVar1) {
      t_where = (File_Position *)__cxa_allocate_exception(0x90);
      psVar3 = (string *)local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_d1 + 1),"Incomplete anonymous function",(allocator *)psVar3);
      File_Position::File_Position(&local_dc,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffe60);
      exception::eval_error::eval_error
                (in_stack_fffffffffffffe90,psVar3,t_where,in_stack_fffffffffffffe78);
      __cxa_throw(t_where,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    Decl_Arg_List((ChaiScript_Parser *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                 );
    bVar1 = Char(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,(bool)in_stack_fffffffffffffed6
                );
    if (!bVar1) {
      local_ad = 1;
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff60,"Incomplete anonymous function",&local_a1);
      File_Position::File_Position(&local_ac,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffe60);
      exception::eval_error::eval_error
                (this_00,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
      local_ad = 0;
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar1 = Eol(in_stack_fffffffffffffe60);
    } while (bVar1);
    bVar1 = Block((ChaiScript_Parser *)in_stack_ffffffffffffff10);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x90);
      psVar3 = (string *)&stack0xfffffffffffffeff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Incomplete anonymous function",(allocator *)psVar3);
      File_Position::File_Position
                ((File_Position *)&stack0xfffffffffffffef4,*(int *)(in_RDI + 0xcb8),
                 *(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffe60);
      exception::eval_error::eval_error
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 psVar3);
      __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"",&local_131);
    build_match<chaiscript::eval::Lambda_AST_Node>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool Lambda() {
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("fun")) {
          retval = true;

          if (Char('[')) {
            Id_Arg_List();
            if (!Char(']')) {
              throw exception::eval_error("Incomplete anonymous function bind", File_Position(m_position.line, m_position.col), *m_filename);
            }
          } else {
            // make sure we always have the same number of nodes
            build_match<eval::Arg_List_AST_Node>(prev_stack_top);
          }

          if (Char('(')) {
            Decl_Arg_List();
            if (!Char(')')) {
              throw exception::eval_error("Incomplete anonymous function", File_Position(m_position.line, m_position.col), *m_filename);
            }
          } else {
            throw exception::eval_error("Incomplete anonymous function", File_Position(m_position.line, m_position.col), *m_filename);
          }


          while (Eol()) {}

          if (!Block()) {
            throw exception::eval_error("Incomplete anonymous function", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Lambda_AST_Node>(prev_stack_top);
        }

        return retval;
      }